

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O0

VRInputDevice *
MinVR::VRFakeTrackerDevice::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  int iVar1;
  VRInputDevice *pVVar2;
  string *in_RDX;
  undefined8 *in_RDI;
  float fVar3;
  VRFakeTrackerDevice *dev;
  VRVector3 startUp;
  VRVector3 startCtr;
  VRVector3 startPos;
  VRFloatArray defaultUp;
  VRFloatArray defaultCtr;
  VRFloatArray defaultPos;
  float up [3];
  float ctr [3];
  float pos [3];
  bool seeker;
  string style;
  int sticky;
  float rScale;
  float zScale;
  float xyScale;
  string rollEvent;
  string translateZEvent;
  string translateEvent;
  string rotateEvent;
  string toggleEvent;
  string trackerName;
  string devNameSpace;
  VRVector3 *in_stack_fffffffffffff6a8;
  undefined4 in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6b4;
  undefined4 in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6bc;
  VRVector3 *in_stack_fffffffffffff6c0;
  VRVector3 *this;
  allocator_type *in_stack_fffffffffffff6d8;
  allocator<char> *in_stack_fffffffffffff6e0;
  float *in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  VRInputDevice *pVVar4;
  undefined8 in_stack_fffffffffffff718;
  undefined1 uVar5;
  string *in_stack_fffffffffffff720;
  float *in_stack_fffffffffffff728;
  string *in_stack_fffffffffffff730;
  VRDataIndex *in_stack_fffffffffffff738;
  string *in_stack_fffffffffffff740;
  string *nameSpace_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff748;
  vector<float,_std::allocator<float>_> *defaultVal;
  string *in_stack_fffffffffffff750;
  string *key;
  VRDataIndex *in_stack_fffffffffffff758;
  VRDataIndex *this_00;
  VRVector3 local_780;
  VRVector3 local_768;
  VRVector3 local_750;
  VRInputDevice *local_738;
  string local_730 [39];
  allocator<char> local_709;
  string local_708 [15];
  undefined1 in_stack_fffffffffffff907;
  string *in_stack_fffffffffffff908;
  string *in_stack_fffffffffffff910;
  VRDataIndex *in_stack_fffffffffffff918;
  VRVector3 local_6d0;
  string local_6b8 [39];
  allocator<char> local_691;
  string local_690 [56];
  VRVector3 local_658;
  string local_640 [39];
  allocator<char> local_619;
  string local_618 [56];
  VRVector3 local_5e0;
  vector<float,_std::allocator<float>_> local_5c1;
  undefined1 local_5a1 [144];
  allocator<char> local_511;
  string local_510 [39];
  allocator<char> local_4e9;
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  undefined4 local_488;
  allocator<char> local_481;
  string local_480 [36];
  int local_45c;
  string local_458 [32];
  undefined4 local_438;
  allocator<char> local_431;
  string local_430 [36];
  float local_40c;
  string local_408 [32];
  undefined4 local_3e8;
  allocator<char> local_3e1;
  string local_3e0 [36];
  float local_3bc;
  string local_3b8 [32];
  undefined4 local_398;
  allocator<char> local_391;
  string local_390 [36];
  float local_36c;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [32];
  string local_268 [32];
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [18];
  undefined1 in_stack_fffffffffffffe1a;
  undefined1 in_stack_fffffffffffffe1b;
  float in_stack_fffffffffffffe1c;
  float in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  string *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  VRFakeTrackerDevice *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe60;
  allocator<char> local_191;
  string local_190 [8];
  VRVector3 *in_stack_fffffffffffffe78;
  VRVector3 *in_stack_fffffffffffffe80;
  VRVector3 *in_stack_fffffffffffffe88;
  allocator<char> local_169;
  string local_168 [32];
  string local_148 [32];
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  VRDatum_conflict *local_e0;
  string local_d8 [32];
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  VRDatum_conflict *local_60;
  string local_58 [32];
  string local_38 [48];
  undefined8 *local_8;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffff718 >> 0x38);
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_b8,local_38);
  local_60 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                        in_stack_fffffffffffff908,(bool)in_stack_fffffffffffff907);
  VRDatumConverter::operator_cast_to_string
            ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffff6a8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_128,local_38);
  local_e0 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                        in_stack_fffffffffffff908,(bool)in_stack_fffffffffffff907);
  VRDatumConverter::operator_cast_to_string
            ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffff6a8);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe48,local_38);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             in_stack_fffffffffffff740,SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_248,local_38);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             in_stack_fffffffffffff740,SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0));
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_2d8,local_38);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             in_stack_fffffffffffff740,SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0));
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_368,local_38);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             in_stack_fffffffffffff740,SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0));
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_398 = 0x3f800000;
  std::__cxx11::string::string(local_3b8,local_38);
  fVar3 = VRDataIndex::getValueWithDefault<float>
                    (in_stack_fffffffffffff738,in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     in_stack_fffffffffffff720,(bool)uVar5);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  local_36c = fVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_3e8 = 0x3f800000;
  std::__cxx11::string::string(local_408,local_38);
  fVar3 = VRDataIndex::getValueWithDefault<float>
                    (in_stack_fffffffffffff738,in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     in_stack_fffffffffffff720,(bool)uVar5);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  local_3bc = fVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_438 = 0x40490fda;
  std::__cxx11::string::string(local_458,local_38);
  fVar3 = VRDataIndex::getValueWithDefault<float>
                    (in_stack_fffffffffffff738,in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     in_stack_fffffffffffff720,(bool)uVar5);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  local_40c = fVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_488 = 0;
  std::__cxx11::string::string(local_4a8,local_38);
  iVar1 = VRDataIndex::getValueWithDefault<int>
                    (in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                     (int *)in_stack_fffffffffffff728,in_stack_fffffffffffff720,(bool)uVar5);
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffff738 >> 0x38);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  local_45c = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string((string *)(local_5a1 + 0x69),local_38);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             in_stack_fffffffffffff740,(bool)uVar5);
  std::__cxx11::string::~string((string *)(local_5a1 + 0x69));
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator(&local_511);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  iVar1 = std::__cxx11::string::compare((char *)local_4c8);
  local_5a1[0x68] = iVar1 == 0;
  local_5a1._97_4_ = 0xbf800000;
  local_5a1._89_8_ = 0;
  local_5a1._81_4_ = 0;
  local_5a1._73_8_ = 0;
  local_5a1._57_8_ = 0x3f80000000000000;
  local_5a1._65_4_ = 0;
  std::allocator<float>::allocator((allocator<float> *)0x18b943);
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8,(float *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8)
  ;
  std::allocator<float>::~allocator((allocator<float> *)0x18b977);
  key = (string *)(local_5a1 + 0x55);
  this_00 = (VRDataIndex *)local_5a1;
  std::allocator<float>::allocator((allocator<float> *)0x18b99c);
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8,(float *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8)
  ;
  std::allocator<float>::~allocator((allocator<float> *)0x18b9d0);
  nameSpace_00 = (string *)(local_5a1 + 0x45);
  defaultVal = &local_5c1;
  std::allocator<float>::allocator((allocator<float> *)0x18b9f5);
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8,(float *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8)
  ;
  std::allocator<float>::~allocator((allocator<float> *)0x18ba29);
  uVar5 = (undefined1)((ulong)&local_619 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_640,local_38);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            (this_00,key,defaultVal,nameSpace_00,(bool)uVar5);
  VRVector3::VRVector3
            (in_stack_fffffffffffff6c0,
             (VRFloatArray *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_640);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_6b8,local_38);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            (this_00,key,defaultVal,nameSpace_00,(bool)uVar5);
  VRVector3::VRVector3
            (in_stack_fffffffffffff6c0,
             (VRFloatArray *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  std::__cxx11::string::string(local_730,local_38);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            (this_00,key,defaultVal,nameSpace_00,(bool)uVar5);
  VRVector3::VRVector3
            (in_stack_fffffffffffff6c0,
             (VRFloatArray *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  pVVar2 = (VRInputDevice *)operator_new(0x268);
  VRVector3::VRVector3
            ((VRVector3 *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
             in_stack_fffffffffffff6a8);
  VRVector3::VRVector3
            ((VRVector3 *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
             in_stack_fffffffffffff6a8);
  VRVector3::VRVector3
            ((VRVector3 *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
             in_stack_fffffffffffff6a8);
  this = &local_750;
  VRFakeTrackerDevice(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                      in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe60,in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe1c,(bool)in_stack_fffffffffffffe1b,
                      (bool)in_stack_fffffffffffffe1a,in_stack_fffffffffffffe78,
                      in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  VRVector3::~VRVector3(&local_780);
  VRVector3::~VRVector3(&local_768);
  VRVector3::~VRVector3(&local_750);
  pVVar4 = (VRInputDevice *)0x0;
  if (pVVar2 != (VRInputDevice *)0x0) {
    pVVar4 = pVVar2 + 1;
  }
  local_738 = pVVar2;
  (**(code **)*local_8)(local_8,pVVar4);
  pVVar2 = local_738;
  VRVector3::~VRVector3(&local_6d0);
  VRVector3::~VRVector3(&local_658);
  VRVector3::~VRVector3(&local_5e0);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)this)
  ;
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)this)
  ;
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)this)
  ;
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return pVVar2;
}

Assistant:

VRInputDevice*
VRFakeTrackerDevice::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {
    std::string devNameSpace = nameSpace;

    // Find and/or set all the default values.
    std::string trackerName = config->getValue("TrackerName", devNameSpace);
    std::string toggleEvent = config->getValue("ToggleOnOffEvent", devNameSpace);
    std::string rotateEvent = config->getValueWithDefault("RotateEvent",
                                                          std::string("Kbdr"),
                                                          devNameSpace);
    std::string translateEvent = config->getValueWithDefault("TranslateEvent",
                                                             std::string("Kbdw"),
                                                             devNameSpace);
    std::string translateZEvent = config->getValueWithDefault("TranslateZEvent",
                                                              std::string("Kbdz"),
                                                              devNameSpace);
    std::string rollEvent = config->getValueWithDefault("RollEvent",
                                                        std::string("Kbde"),
                                                        devNameSpace);
    float xyScale =
      config->getValueWithDefault("XYTranslationScale", 1.0f, devNameSpace);
    float zScale =
      config->getValueWithDefault("ZTranslationScale", 1.0f, devNameSpace);
    float rScale = config->getValueWithDefault("RotationScale",
                                               3.1415926f, devNameSpace);

    int sticky = config->getValueWithDefault("Sticky", 0, devNameSpace);
    std::string style = config->getValueWithDefault("Style",
                                                    std::string("Looker"),
                                                    devNameSpace);
    // We only have two styles, so we can use a boolean for it.  (Note that the
    // 'compare()' method returns a zero when the strings match.)
    bool seeker = !style.compare("Seeker");

    float pos[] = {0, 0, -1};
    float ctr[] = {0, 0, 0};
    float up[] = {0, 1, 0};
    VRFloatArray defaultPos (pos, pos + sizeof(pos) / sizeof(pos[0]));
    VRFloatArray defaultCtr (ctr, ctr + sizeof(ctr) / sizeof(ctr[0]));
    VRFloatArray defaultUp (up, up + sizeof(up) / sizeof(up[0]));
    VRVector3 startPos = config->getValueWithDefault("LookAtEye",
                                                     defaultPos, devNameSpace);
    VRVector3 startCtr = config->getValueWithDefault("LookAtCenter",
                                                     defaultCtr, devNameSpace);
    VRVector3 startUp = config->getValueWithDefault("LookAtUp",
                                                    defaultUp, devNameSpace);

    // Make a new object.
    VRFakeTrackerDevice *dev = new VRFakeTrackerDevice(trackerName,
                                                       toggleEvent,
                                                       rotateEvent,
                                                       rollEvent,
                                                       translateEvent,
                                                       translateZEvent,
                                                       xyScale,
                                                       zScale,
                                                       rScale,
                                                       sticky,
                                                       seeker,
                                                       startPos,
                                                       startCtr,
                                                       startUp);
    vrMain->addEventHandler(dev);

    return dev;
}